

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUHal.cpp
# Opt level: O0

bool __thiscall
RTIMUHal::HALRead(RTIMUHal *this,uchar slaveAddr,uchar length,uchar *data,char *errorMsg)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  size_t sVar4;
  undefined8 local_168;
  spi_ioc_transfer rdIOC;
  uchar rxBuff [256];
  uint local_3c;
  int total;
  int result;
  int tries;
  char *errorMsg_local;
  uchar *data_local;
  uchar length_local;
  uchar slaveAddr_local;
  RTIMUHal *this_local;
  
  if ((this->m_busIsI2C & 1U) == 0) {
    memset(&local_168,0,0x20);
    local_168 = 0;
    rdIOC.tx_buf = (__u64)&rdIOC.delay_usecs;
    rdIOC.rx_buf._0_4_ = (uint)length;
    iVar2 = ioctl(this->m_SPI,0x40206b00,&local_168);
    if (iVar2 < 0) {
      sVar4 = strlen(errorMsg);
      if (sVar4 != 0) {
        fprintf(_stderr,"SPI read error from - %s\n",errorMsg);
      }
      return false;
    }
    memcpy(data,&rdIOC.delay_usecs,(ulong)length);
  }
  else {
    bVar1 = I2CSelectSlave(this,slaveAddr,errorMsg);
    if (!bVar1) {
      return false;
    }
    local_3c = 0;
    for (total = 0; (int)local_3c < (int)(uint)length && total < 5; total = total + 1) {
      sVar3 = read(this->m_I2C,data + (int)local_3c,(long)(int)(length - local_3c));
      if ((int)sVar3 < 0) {
        sVar4 = strlen(errorMsg);
        if (sVar4 != 0) {
          fprintf(_stderr,"I2C read error from %d - %s\n",(ulong)slaveAddr,errorMsg);
        }
        return false;
      }
      local_3c = (int)sVar3 + local_3c;
      if (local_3c == length) break;
      delayMs(this,10);
    }
    if ((int)local_3c < (int)(uint)length) {
      sVar4 = strlen(errorMsg);
      if (sVar4 != 0) {
        fprintf(_stderr,"I2C read from %d failed - %s\n",(ulong)slaveAddr,errorMsg);
      }
      return false;
    }
  }
  return true;
}

Assistant:

bool RTIMUHal::HALRead(unsigned char slaveAddr, unsigned char length,
                    unsigned char *data, const char *errorMsg)
{
    int tries, result, total;
    unsigned char rxBuff[MAX_READ_LEN + 1];
    struct spi_ioc_transfer rdIOC;

    if (m_busIsI2C) {
        if (!I2CSelectSlave(slaveAddr, errorMsg))
            return false;

        total = 0;
        tries = 0;

        while ((total < length) && (tries < 5)) {
            result = read(m_I2C, data + total, length - total);

            if (result < 0) {
                if (strlen(errorMsg) > 0)
                    HAL_ERROR2("I2C read error from %d - %s\n", slaveAddr, errorMsg);
                return false;
            }

            total += result;

            if (total == length)
                break;

            delayMs(10);
            tries++;
        }

        if (total < length) {
            if (strlen(errorMsg) > 0)
                HAL_ERROR2("I2C read from %d failed - %s\n", slaveAddr, errorMsg);
            return false;
        }
    } else {
        memset(&rdIOC, 0, sizeof(rdIOC));
        rdIOC.tx_buf = 0;
        rdIOC.rx_buf = (unsigned long) rxBuff;
        rdIOC.len = length;

        if (ioctl(m_SPI, SPI_IOC_MESSAGE(1), &rdIOC) < 0) {
            if (strlen(errorMsg) > 0)
                HAL_ERROR1("SPI read error from - %s\n", errorMsg);
            return false;
        }
        memcpy(data, rxBuff, length);
    }
    return true;
}